

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O0

void __thiscall AstWalker::visitWhileStatementAstNode(AstWalker *this,WhileStatementAstNode *node)

{
  element_type *peVar1;
  element_type *peVar2;
  WhileStatementAstNode *node_local;
  AstWalker *this_local;
  
  (*this->_vptr_AstWalker[0x17])(this,node);
  peVar1 = std::__shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(node->expression).
                       super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*this->_vptr_AstWalker[3])(this,peVar1);
  peVar2 = std::__shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(node->statement).
                       super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*this->_vptr_AstWalker[2])(this,peVar2);
  (*this->_vptr_AstWalker[0x26])(this,node);
  return;
}

Assistant:

void AstWalker::visitWhileStatementAstNode(WhileStatementAstNode* node) noexcept {
  this->onEnterWhileStatementAstNode(node);
  this->visitExpressionAstNode(node->expression.get());
  this->visitStatementAstNode(node->statement.get());
  this->onExitWhileStatementAstNode(node);
}